

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

Vector<kj::CompressionParameters> *
kj::_::findValidExtensionOffers
          (Vector<kj::CompressionParameters> *__return_storage_ptr__,StringPtr offers)

{
  bool bVar1;
  ArrayPtr<const_char> *pAVar2;
  ArrayPtr<const_char> *this;
  NullableValue<kj::CompressionParameters> *other;
  CompressionParameters *pCVar3;
  Vector<kj::CompressionParameters> *pVVar4;
  char in_R8B;
  ArrayPtr<const_char> AVar5;
  ArrayPtr<const_char> input;
  undefined1 local_180 [8];
  Maybe<unsigned_long> tempWindow;
  bool tempCtx;
  CompressionParameters *validated;
  undefined1 local_130 [8];
  NullableValue<kj::CompressionParameters> _validated5087;
  ArrayPtr<const_char> local_f8;
  ArrayPtr<const_char> local_e8;
  _ *local_d8;
  char *pcStack_d0;
  undefined1 local_c0 [8];
  Vector<kj::ArrayPtr<const_char>_> splitOffer;
  ArrayPtr<const_char> *offer;
  ArrayPtr<const_char> *__end2;
  ArrayPtr<const_char> *__begin2;
  Vector<kj::ArrayPtr<const_char>_> *__range2;
  undefined1 local_60 [8];
  Vector<kj::ArrayPtr<const_char>_> extensions;
  Vector<kj::CompressionParameters> result;
  StringPtr offers_local;
  
  result.builder.disposer = (ArrayDisposer *)offers.content.ptr;
  Vector<kj::CompressionParameters>::Vector
            ((Vector<kj::CompressionParameters> *)&extensions.builder.disposer);
  AVar5 = StringPtr::operator_cast_to_ArrayPtr((StringPtr *)&result.builder.disposer);
  input.ptr = (char *)AVar5.size_;
  input.size_ = 0x2c;
  splitParts((Vector<kj::ArrayPtr<const_char>_> *)local_60,(_ *)AVar5.ptr,input,in_R8B);
  __end2 = Vector<kj::ArrayPtr<const_char>_>::begin((Vector<kj::ArrayPtr<const_char>_> *)local_60);
  pAVar2 = Vector<kj::ArrayPtr<const_char>_>::end((Vector<kj::ArrayPtr<const_char>_> *)local_60);
  for (; __end2 != pAVar2; __end2 = __end2 + 1) {
    splitOffer.builder.disposer = (ArrayDisposer *)__end2;
    local_d8 = (_ *)__end2->ptr;
    pcStack_d0 = (char *)__end2->size_;
    AVar5.size_ = 0x3b;
    AVar5.ptr = pcStack_d0;
    splitParts((Vector<kj::ArrayPtr<const_char>_> *)local_c0,local_d8,AVar5,in_R8B);
    this = Vector<kj::ArrayPtr<const_char>_>::front((Vector<kj::ArrayPtr<const_char>_> *)local_c0);
    AVar5 = (ArrayPtr<const_char>)operator____kj("permessage-deflate",0x12);
    local_f8 = AVar5;
    AVar5 = StringPtr::operator_cast_to_ArrayPtr((StringPtr *)&local_f8);
    local_e8 = AVar5;
    bVar1 = ArrayPtr<const_char>::operator==(this,&local_e8);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      tryExtractParameters
                ((Maybe<kj::CompressionParameters> *)&validated,
                 (Vector<kj::ArrayPtr<const_char>_> *)local_c0,false);
      other = readMaybe<kj::CompressionParameters>((Maybe<kj::CompressionParameters> *)&validated);
      NullableValue<kj::CompressionParameters>::NullableValue
                ((NullableValue<kj::CompressionParameters> *)local_130,other);
      Maybe<kj::CompressionParameters>::~Maybe((Maybe<kj::CompressionParameters> *)&validated);
      pCVar3 = NullableValue::operator_cast_to_CompressionParameters_((NullableValue *)local_130);
      if (pCVar3 != (CompressionParameters *)0x0) {
        pCVar3 = NullableValue<kj::CompressionParameters>::operator*
                           ((NullableValue<kj::CompressionParameters> *)local_130);
        tempWindow.ptr.field_1.value._7_1_ = pCVar3->inboundNoContextTakeover & 1;
        pCVar3->inboundNoContextTakeover = (bool)(pCVar3->outboundNoContextTakeover & 1);
        pCVar3->outboundNoContextTakeover = (bool)tempWindow.ptr.field_1.value._7_1_;
        Maybe<unsigned_long>::Maybe((Maybe<unsigned_long> *)local_180,&pCVar3->inboundMaxWindowBits)
        ;
        Maybe<unsigned_long>::operator=
                  (&pCVar3->inboundMaxWindowBits,&pCVar3->outboundMaxWindowBits);
        Maybe<unsigned_long>::operator=
                  (&pCVar3->outboundMaxWindowBits,(Maybe<unsigned_long> *)local_180);
        pCVar3 = mv<kj::CompressionParameters>(pCVar3);
        Vector<kj::CompressionParameters>::add<kj::CompressionParameters>
                  ((Vector<kj::CompressionParameters> *)&extensions.builder.disposer,pCVar3);
        Maybe<unsigned_long>::~Maybe((Maybe<unsigned_long> *)local_180);
      }
      NullableValue<kj::CompressionParameters>::~NullableValue
                ((NullableValue<kj::CompressionParameters> *)local_130);
      _validated5087.field_1._36_4_ = 0;
    }
    else {
      _validated5087.field_1._36_4_ = 3;
    }
    Vector<kj::ArrayPtr<const_char>_>::~Vector((Vector<kj::ArrayPtr<const_char>_> *)local_c0);
  }
  pVVar4 = mv<kj::Vector<kj::CompressionParameters>>
                     ((Vector<kj::CompressionParameters> *)&extensions.builder.disposer);
  Vector<kj::CompressionParameters>::Vector(__return_storage_ptr__,pVVar4);
  _validated5087.field_1._36_4_ = 1;
  Vector<kj::ArrayPtr<const_char>_>::~Vector((Vector<kj::ArrayPtr<const_char>_> *)local_60);
  Vector<kj::CompressionParameters>::~Vector
            ((Vector<kj::CompressionParameters> *)&extensions.builder.disposer);
  return __return_storage_ptr__;
}

Assistant:

kj::Vector<CompressionParameters> findValidExtensionOffers(StringPtr offers) {
  // A function to be called by the client that wants to offer extensions through
  // `Sec-WebSocket-Extensions`. This function takes the value of the header (a string) and
  // populates a Vector of all the valid offers.
  kj::Vector<CompressionParameters> result;

  auto extensions = splitParts(offers, ',');

  for (const auto& offer : extensions) {
    auto splitOffer = splitParts(offer, ';');
    if (splitOffer.front() != "permessage-deflate"_kj) {
      continue;
    }
    KJ_IF_SOME(validated, tryExtractParameters(splitOffer, false)) {
      // We need to swap the inbound/outbound properties since `tryExtractParameters` thinks we're
      // parsing as the server (`isAgreement` is false).
      auto tempCtx = validated.inboundNoContextTakeover;
      validated.inboundNoContextTakeover = validated.outboundNoContextTakeover;
      validated.outboundNoContextTakeover = tempCtx;
      auto tempWindow = validated.inboundMaxWindowBits;
      validated.inboundMaxWindowBits = validated.outboundMaxWindowBits;
      validated.outboundMaxWindowBits = tempWindow;
      result.add(kj::mv(validated));
    }
  }

  return kj::mv(result);
}